

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

mp_limb_t mpn_invert_3by2(mp_limb_t u1,mp_limb_t u0)

{
  mp_limb_t __v;
  ulong uVar1;
  mp_limb_t mVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  mp_limb_t mVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if ((long)u1 < 0) {
    uVar1 = ~u1 / (u1 >> 0x20);
    uVar3 = ~u1 % (u1 >> 0x20) << 0x20 | 0xffffffff;
    uVar5 = (u1 & 0xffffffff) * uVar1;
    if (uVar3 < uVar5) {
      uVar3 = uVar3 + u1;
      if (uVar3 < uVar5 && u1 <= uVar3) {
        uVar1 = uVar1 + 0xfffffffe;
        uVar3 = uVar3 + u1;
      }
      else {
        uVar1 = uVar1 + 0xffffffff;
      }
    }
    uVar3 = uVar3 - uVar5;
    uVar7 = (uVar1 & 0xffffffff) * (uVar3 >> 0x20) + uVar3;
    uVar5 = uVar7 >> 0x20;
    uVar3 = ~uVar5 * u1 + (uVar3 << 0x20 | 0xffffffff);
    uVar7 = uVar7 << 0x20;
    mVar2 = 0;
    if (uVar7 <= uVar3) {
      mVar2 = u1;
    }
    uVar4 = mVar2 + uVar3;
    mVar2 = ((uVar1 << 0x20) + uVar5 + (ulong)(uVar3 < uVar7) + 1) - (ulong)(uVar4 < u1);
    if (u0 != 0) {
      mVar6 = 0;
      if (u1 <= uVar4) {
        mVar6 = u1;
      }
      uVar1 = ~uVar4 + u0 + mVar6;
      if (uVar1 < u0) {
        mVar6 = 0;
        if (uVar1 >= u1) {
          mVar6 = u1;
        }
        mVar2 = mVar2 + ((ulong)(uVar1 < u1) | 0xfffffffffffffffe);
        uVar1 = uVar1 - (mVar6 + u1);
      }
      uVar7 = (mVar2 & 0xffffffff) * (u0 & 0xffffffff);
      uVar3 = (mVar2 & 0xffffffff) * (u0 >> 0x20);
      lVar9 = (mVar2 >> 0x20) * (u0 >> 0x20);
      uVar5 = (u0 & 0xffffffff) * (mVar2 >> 0x20) + uVar3 + (uVar7 >> 0x20);
      lVar8 = lVar9 + 0x100000000;
      if (uVar3 <= uVar5) {
        lVar8 = lVar9;
      }
      uVar3 = (uVar5 >> 0x20) + lVar8;
      uVar4 = uVar3 + uVar1;
      if (CARRY8(uVar3,uVar1)) {
        mVar2 = mVar2 + ~(ulong)(u0 < (uVar7 & 0xffffffff | uVar5 << 0x20) && uVar4 == u1 ||
                                u1 < uVar4);
      }
    }
    return mVar2;
  }
  __assert_fail("u1 >= GMP_LIMB_HIGHBIT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x2e5,"mp_limb_t mpn_invert_3by2(mp_limb_t, mp_limb_t)");
}

Assistant:

mp_limb_t
mpn_invert_3by2 (mp_limb_t u1, mp_limb_t u0)
{
  mp_limb_t r, p, m, ql;
  unsigned ul, uh, qh;

  assert (u1 >= GMP_LIMB_HIGHBIT);

  /* For notation, let b denote the half-limb base, so that B = b^2.
     Split u1 = b uh + ul. */
  ul = u1 & GMP_LLIMB_MASK;
  uh = u1 >> (GMP_LIMB_BITS / 2);

  /* Approximation of the high half of quotient. Differs from the 2/1
     inverse of the half limb uh, since we have already subtracted
     u0. */
  qh = ~u1 / uh;

  /* Adjust to get a half-limb 3/2 inverse, i.e., we want

     qh' = floor( (b^3 - 1) / u) - b = floor ((b^3 - b u - 1) / u
         = floor( (b (~u) + b-1) / u),

     and the remainder

     r = b (~u) + b-1 - qh (b uh + ul)
       = b (~u - qh uh) + b-1 - qh ul

     Subtraction of qh ul may underflow, which implies adjustments.
     But by normalization, 2 u >= B > qh ul, so we need to adjust by
     at most 2.
  */

  r = ((~u1 - (mp_limb_t) qh * uh) << (GMP_LIMB_BITS / 2)) | GMP_LLIMB_MASK;

  p = (mp_limb_t) qh * ul;
  /* Adjustment steps taken from udiv_qrnnd_c */
  if (r < p)
    {
      qh--;
      r += u1;
      if (r >= u1) /* i.e. we didn't get carry when adding to r */
	if (r < p)
	  {
	    qh--;
	    r += u1;
	  }
    }
  r -= p;

  /* Low half of the quotient is

       ql = floor ( (b r + b-1) / u1).

     This is a 3/2 division (on half-limbs), for which qh is a
     suitable inverse. */

  p = (r >> (GMP_LIMB_BITS / 2)) * qh + r;
  /* Unlike full-limb 3/2, we can add 1 without overflow. For this to
     work, it is essential that ql is a full mp_limb_t. */
  ql = (p >> (GMP_LIMB_BITS / 2)) + 1;

  /* By the 3/2 trick, we don't need the high half limb. */
  r = (r << (GMP_LIMB_BITS / 2)) + GMP_LLIMB_MASK - ql * u1;

  if (r >= (p << (GMP_LIMB_BITS / 2)))
    {
      ql--;
      r += u1;
    }
  m = ((mp_limb_t) qh << (GMP_LIMB_BITS / 2)) + ql;
  if (r >= u1)
    {
      m++;
      r -= u1;
    }

  /* Now m is the 2/1 invers of u1. If u0 > 0, adjust it to become a
     3/2 inverse. */
  if (u0 > 0)
    {
      mp_limb_t th, tl;
      r = ~r;
      r += u0;
      if (r < u0)
	{
	  m--;
	  if (r >= u1)
	    {
	      m--;
	      r -= u1;
	    }
	  r -= u1;
	}
      gmp_umul_ppmm (th, tl, u0, m);
      r += th;
      if (r < th)
	{
	  m--;
	  m -= ((r > u1) | ((r == u1) & (tl > u0)));
	}
    }

  return m;
}